

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_every(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  JSValue this_obj;
  uint uVar1;
  int iVar2;
  uint *puVar3;
  JSValueUnion JVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  JSValueUnion *pJVar7;
  JSRefCountHeader *p;
  JSValueUnion JVar8;
  ulong uVar9;
  int64_t iVar10;
  bool bVar11;
  JSValue func_obj;
  JSValue v;
  JSValue this_val_00;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue len_val;
  JSValueUnion local_100;
  JSValueUnion local_e8;
  int64_t local_e0;
  int64_t local_d8;
  JSValueUnion local_d0;
  JSValueUnion local_c8;
  JSValueUnion local_c0;
  int64_t len;
  ulong local_b0;
  ulong local_a8;
  JSValueUnion local_a0;
  JSValueUnion *local_98;
  ulong local_90;
  int64_t local_88;
  JSValueUnion local_80;
  JSValueUnion local_78;
  int64_t local_70;
  JSValueUnion local_68;
  ulong local_60;
  JSValue local_58;
  JSValue local_40;
  
  local_e8.ptr = (void *)(local_e8 << 0x20);
  local_e0 = 3;
  local_d0.int32 = special;
  pJVar7 = &argv->u;
  if ((special & 8U) == 0) {
    this_val = JS_ToObject(ctx,this_val);
    uVar1 = js_get_length64(ctx,&len,this_val);
    puVar3 = (uint *)(ulong)uVar1;
    if (uVar1 == 0) goto LAB_0015399c;
LAB_00153971:
    JVar12 = (JSValue)(ZEXT816(3) << 0x40);
    goto LAB_00153ef3;
  }
  if (0xfffffff4 < (uint)this_val.tag) {
    *(int *)this_val.u.ptr = *this_val.u.ptr + 1;
  }
  iVar2 = js_typed_array_get_length_internal(ctx,this_val);
  puVar3 = (uint *)(long)iVar2;
  len = (int64_t)puVar3;
  if (iVar2 < 0) goto LAB_00153971;
LAB_0015399c:
  JVar4 = (JSValueUnion)(argv->u).ptr;
  iVar6 = argv->tag;
  if (argc < 2) {
    local_98 = (JSValueUnion *)0x3;
    local_c0.float64 = 0.0;
    local_a0.float64 = 0.0;
  }
  else {
    local_98 = (JSValueUnion *)argv[1].tag;
    local_c0.ptr = argv[1].u.ptr & 0xffffffff;
    local_a0.ptr = argv[1].u.ptr & 0xffffffff00000000;
  }
  uVar1 = check_function(ctx,*argv);
  puVar3 = (uint *)(ulong)uVar1;
  JVar12 = (JSValue)(ZEXT816(3) << 0x40);
  if (uVar1 != 0) goto LAB_00153ef3;
  JVar8.float64 = 0.0;
  puVar3 = (uint *)((ulong)local_d0.ptr & 0xffffffff);
  uVar9 = (ulong)local_d0.ptr & 0xffffffff;
  iVar10 = 3;
  local_88 = iVar6;
  local_80 = JVar4;
  if (0xc < (uint)local_d0._0_4_) goto switchD_00153a57_caseD_2;
  puVar3 = &switchD_00153a57::switchdataD_00167d98;
  switch(uVar9) {
  case 0:
  case 8:
    JVar8.float64 = 4.94065645841247e-324;
    iVar10 = 1;
    break;
  case 1:
  case 9:
    iVar10 = 1;
    break;
  case 3:
    bVar11 = (int)len == len;
    JVar4.float64 = (double)len;
    if (bVar11) {
      JVar4.ptr = (void *)(len & 0xffffffff);
    }
    pJVar7 = (JSValueUnion *)0x0;
    if (!bVar11) {
      pJVar7 = (JSValueUnion *)0x7;
    }
    goto LAB_00153ae2;
  case 4:
    JVar4.float64 = 0.0;
    pJVar7 = (JSValueUnion *)0x0;
LAB_00153ae2:
    len_val.tag = (int64_t)pJVar7;
    len_val.u.float64 = JVar4.float64;
    JVar12 = JS_ArraySpeciesCreate(ctx,this_val,len_val);
    goto LAB_00153ae7;
  case 0xb:
    local_68.ptr = (void *)(len & 0xffffffff);
    local_60 = 0;
    JVar13.tag = (int64_t)&local_78;
    JVar13.u.float64 = 9.88131291682493e-324;
    _local_78 = this_val;
    JVar12 = js_typed_array___speciesCreate
                       (ctx,JVar13,(&switchD_00153a57::switchdataD_00167d98)[uVar9] + 0x167d98,
                        (JSValue *)pJVar7);
    goto LAB_00153ae7;
  case 0xc:
    JVar12 = JS_NewArray(ctx);
LAB_00153ae7:
    puVar3 = (uint *)((ulong)JVar12.u.ptr >> 0x20);
    if ((int)JVar12.tag != 6) goto LAB_00153afb;
    goto LAB_00153ef3;
  }
switchD_00153a57_caseD_2:
  JVar12.tag = iVar10;
  JVar12.u.float64 = JVar8.float64;
LAB_00153afb:
  local_d8 = JVar12.tag;
  local_a0.float64 = local_a0.float64 | local_c0.float64;
  local_b0 = (long)puVar3 << 0x20;
  local_c8.ptr = (void *)((ulong)JVar12.u.ptr & 0xffffffff | local_b0);
  local_a8 = 0;
  JVar4 = (JSValueUnion)len;
  if (len < 1) {
    JVar4.float64 = 0.0;
  }
  JVar8.float64 = 0.0;
  local_c0 = JVar4;
  local_90 = uVar9;
  while( true ) {
    iVar6 = JVar12.tag;
    local_100 = JVar12.u;
    if (local_c0.ptr == JVar8.ptr) break;
    if (((ulong)local_d0.ptr & 8) == 0) {
      pJVar7 = &local_e8;
      JVar4 = JVar8;
      iVar2 = JS_TryGetPropertyInt64(ctx,this_val,(int64_t)JVar8,(JSValue *)pJVar7);
      iVar6 = local_d8;
      if (iVar2 < 0) goto LAB_00153eee;
      if (iVar2 != 0) goto LAB_00153bc4;
    }
    else {
      _local_e8 = JS_GetPropertyInt64(ctx,this_val,(int64_t)JVar8);
      iVar6 = local_d8;
      if (local_e8._8_4_ == 6) goto LAB_00153eee;
LAB_00153bc4:
      uVar9 = (ulong)JVar8.ptr >> 0x1f;
      JVar5.float64 = (double)JVar8.float64;
      if (uVar9 == 0) {
        JVar5 = JVar8;
      }
      if (uVar9 != 0) {
        uVar9 = 7;
      }
      _local_78 = _local_e8;
      this_obj.tag = (int64_t)local_98;
      this_obj.u.ptr = local_a0.ptr;
      func_obj.tag = local_88;
      func_obj.u.float64 = local_80.float64;
      JVar4 = local_a0;
      pJVar7 = local_98;
      local_68 = JVar5;
      local_60 = uVar9;
      local_58 = this_val;
      JVar12 = JS_Call(ctx,func_obj,this_obj,3,(JSValue *)&local_78);
      v.tag = uVar9;
      v.u.float64 = JVar5.float64;
      local_40 = JVar12;
      JS_FreeValue(ctx,v);
      iVar6 = local_d8;
      if ((int)JVar12.tag == 6) goto LAB_00153eee;
      if ((uint)local_d0._0_4_ < 0xd) {
        JVar12 = (JSValue)(*(code *)(&DAT_00167dcc + *(int *)(&DAT_00167dcc + local_90 * 4)))();
        return JVar12;
      }
      JS_FreeValue(ctx,JVar12);
      JS_FreeValue(ctx,_local_e8);
      local_e8.ptr = (void *)(local_e8 << 0x20);
      local_e0 = 3;
    }
    JVar12.tag = iVar6;
    JVar12.u.ptr = local_100.ptr;
    JVar8.float64 = JVar8.float64 + 1;
  }
  if (local_d0._0_4_ == 0xc) {
    local_68.ptr = (void *)(local_a8 & 0xffffffff);
    local_60 = 0;
    this_val_00.tag = (int64_t)&local_78;
    this_val_00.u.float64 = 9.88131291682493e-324;
    _local_78 = this_val;
    JVar12 = js_typed_array___speciesCreate(ctx,this_val_00,JVar4.int32,(JSValue *)pJVar7);
    local_d0 = JVar12.u;
    if ((int)JVar12.tag != 6) {
      local_70 = iVar6;
      local_78.ptr = local_c8.ptr;
      JVar13 = JS_Invoke(ctx,JVar12,0x42,1,(JSValue *)&local_78);
      iVar2 = check_exception_free(ctx,JVar13);
      if (iVar2 == 0) {
        v_00.tag = iVar6;
        v_00.u.ptr = local_c8.ptr;
        JS_FreeValue(ctx,v_00);
        iVar6 = JVar12.tag;
        local_100 = local_d0;
        uVar9 = (ulong)local_d0.ptr & 0xffffffff00000000;
        goto LAB_00153f65;
      }
    }
LAB_00153eee:
    JVar12.tag = iVar6;
    JVar12.u.ptr = local_100.ptr;
LAB_00153ef3:
    v_01.u.ptr = (void *)((ulong)JVar12.u.ptr & 0xffffffff | (long)puVar3 << 0x20);
    v_01.tag = JVar12.tag;
    JS_FreeValue(ctx,v_01);
    JS_FreeValue(ctx,_local_e8);
    JS_FreeValue(ctx,this_val);
    iVar6 = 6;
    JVar4.float64 = 0.0;
  }
  else {
    local_100.float64 = local_100.float64 & 0xffffffff;
    uVar9 = local_b0;
LAB_00153f65:
    JS_FreeValue(ctx,_local_e8);
    JS_FreeValue(ctx,this_val);
    JVar4.ptr = (void *)((ulong)local_100.ptr & 0xffffffff | uVar9);
  }
  JVar14.tag = iVar6;
  JVar14.u.float64 = JVar4.float64;
  return JVar14;
}

Assistant:

static JSValue js_array_every(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int special)
{
    JSValue obj, val, index_val, res, ret;
    JSValueConst args[3];
    JSValueConst func, this_arg;
    int64_t len, k, n;
    int present;

    ret = JS_UNDEFINED;
    val = JS_UNDEFINED;
    if (special & special_TA) {
        obj = JS_DupValue(ctx, this_val);
        len = js_typed_array_get_length_internal(ctx, obj);
        if (len < 0)
            goto exception;
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (js_get_length64(ctx, &len, obj))
            goto exception;
    }
    func = argv[0];
    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];
        
    if (check_function(ctx, func))
        goto exception;

    switch (special) {
    case special_every:
    case special_every | special_TA:
        ret = JS_TRUE;
        break;
    case special_some:
    case special_some | special_TA:
        ret = JS_FALSE;
        break;
    case special_map:
        /* XXX: JS_ArraySpeciesCreate should take int64_t */
        ret = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt64(ctx, len));
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_filter:
        ret = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_map | special_TA:
        args[0] = obj;
        args[1] = JS_NewInt32(ctx, len);
        ret = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_filter | special_TA:
        ret = JS_NewArray(ctx);
        if (JS_IsException(ret))
            goto exception;
        break;
    }
    n = 0;

    for(k = 0; k < len; k++) {
        if (special & special_TA) {
            val = JS_GetPropertyInt64(ctx, obj, k);
            if (JS_IsException(val))
                goto exception;
            present = TRUE;
        } else {
            present = JS_TryGetPropertyInt64(ctx, obj, k, &val);
            if (present < 0)
                goto exception;
        }
        if (present) {
            index_val = JS_NewInt64(ctx, k);
            if (JS_IsException(index_val))
                goto exception;
            args[0] = val;
            args[1] = index_val;
            args[2] = obj;
            res = JS_Call(ctx, func, this_arg, 3, args);
            JS_FreeValue(ctx, index_val);
            if (JS_IsException(res))
                goto exception;
            switch (special) {
            case special_every:
            case special_every | special_TA:
                if (!JS_ToBoolFree(ctx, res)) {
                    ret = JS_FALSE;
                    goto done;
                }
                break;
            case special_some:
            case special_some | special_TA:
                if (JS_ToBoolFree(ctx, res)) {
                    ret = JS_TRUE;
                    goto done;
                }
                break;
            case special_map:
                if (JS_DefinePropertyValueInt64(ctx, ret, k, res,
                                                JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
                break;
            case special_map | special_TA:
                if (JS_SetPropertyValue(ctx, ret, JS_NewInt32(ctx, k), res, JS_PROP_THROW) < 0)
                    goto exception;
                break;
            case special_filter:
            case special_filter | special_TA:
                if (JS_ToBoolFree(ctx, res)) {
                    if (JS_DefinePropertyValueInt64(ctx, ret, n++, JS_DupValue(ctx, val),
                                                    JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                }
                break;
            default:
                JS_FreeValue(ctx, res);
                break;
            }
            JS_FreeValue(ctx, val);
            val = JS_UNDEFINED;
        }
    }
done:
    if (special == (special_filter | special_TA)) {
        JSValue arr;
        args[0] = obj;
        args[1] = JS_NewInt32(ctx, n);
        arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
        if (JS_IsException(arr))
            goto exception;
        args[0] = ret;
        res = JS_Invoke(ctx, arr, JS_ATOM_set, 1, args);
        if (check_exception_free(ctx, res))
            goto exception;
        JS_FreeValue(ctx, ret);
        ret = arr;
    }
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return ret;

exception:
    JS_FreeValue(ctx, ret);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}